

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O2

UCollationResult __thiscall
icu_63::Collator::internalCompareUTF8
          (Collator *this,char *left,int32_t leftLength,char *right,int32_t rightLength,
          UErrorCode *errorCode)

{
  UCollationResult UVar1;
  size_t sVar2;
  char *local_48;
  int32_t local_40;
  char *local_38;
  int32_t local_30;
  
  UVar1 = UCOL_EQUAL;
  if (U_ZERO_ERROR < *errorCode) {
    return UCOL_EQUAL;
  }
  if ((left == (char *)0x0 && leftLength != 0) || (rightLength != 0 && right == (char *)0x0)) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    if (leftLength < 0) {
      sVar2 = strlen(left);
      leftLength = (int32_t)sVar2;
    }
    local_48 = left;
    local_40 = leftLength;
    if (rightLength < 0) {
      sVar2 = strlen(right);
      rightLength = (int32_t)sVar2;
    }
    local_38 = right;
    local_30 = rightLength;
    UVar1 = (*(this->super_UObject)._vptr_UObject[0xd])(this,&local_48,&local_38,errorCode);
  }
  return UVar1;
}

Assistant:

UCollationResult
Collator::internalCompareUTF8(const char *left, int32_t leftLength,
                              const char *right, int32_t rightLength,
                              UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return UCOL_EQUAL; }
    if((left == NULL && leftLength != 0) || (right == NULL && rightLength != 0)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_EQUAL;
    }
    return compareUTF8(
            StringPiece(left, (leftLength < 0) ? static_cast<int32_t>(uprv_strlen(left)) : leftLength),
            StringPiece(right, (rightLength < 0) ? static_cast<int32_t>(uprv_strlen(right)) : rightLength),
            errorCode);
}